

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManDivRemoveLits(Vec_Int_t *vCube,Vec_Int_t *vDiv,int fCompl)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint i;
  int iVar4;
  
  if ((fCompl != 0) && (vDiv->nSize != 4)) {
    __assert_fail("!fCompl || Vec_IntSize(vDiv) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x29e,"int Fx_ManDivRemoveLits(Vec_Int_t *, Vec_Int_t *, int)");
  }
  iVar4 = 0;
  for (i = 0; (int)i < vDiv->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vDiv,i);
    uVar2 = Abc_Lit2Var(iVar1);
    iVar3 = Vec_IntRemove1(vCube,(1 < i && fCompl != 0) ^ uVar2);
    iVar4 = iVar3 + iVar4;
    if (vDiv->nSize == 2) {
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitNot(iVar1);
      iVar1 = Vec_IntRemove1(vCube,iVar1);
      iVar4 = iVar4 + iVar1;
    }
  }
  return iVar4;
}

Assistant:

static inline int Fx_ManDivRemoveLits( Vec_Int_t * vCube, Vec_Int_t * vDiv, int fCompl )
{
    int i, Lit, Count = 0;
    assert( !fCompl || Vec_IntSize(vDiv) == 4 );
    Vec_IntForEachEntry( vDiv, Lit, i )
    {
        Count += Vec_IntRemove1( vCube, Abc_Lit2Var(Lit) ^ (fCompl && i > 1) );  // the last two lits can be complemented
        if ( Vec_IntSize( vDiv ) == 2 )
            Count += Vec_IntRemove1( vCube, Abc_LitNot( Abc_Lit2Var(Lit) ) );
    }
    return Count;
}